

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::absolute_y
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  AccessType type_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  if (type == Read) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructAbsoluteYRead)
    ;
  }
  else {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructAbsoluteY);
  }
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncorrectDataAddress);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void absolute_y(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// AAL.
		target(CycleFetchIncrementPC);			// AAH.

		if(type == AccessType::Read) {
			target(OperationConstructAbsoluteYRead);	// Calculate data address, potentially skipping the next fetch.
		} else {
			target(OperationConstructAbsoluteY);		// Calculate data address.
		}
		target(CycleFetchIncorrectDataAddress);	// Do the dummy read if necessary; OperationConstructAbsoluteYRead
												// will skip this if it isn't required.

		read_write(type, is8bit, target);
	}